

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

Abc_ManCut_t *
Abc_NtkManCutStart(int nNodeSizeMax,int nConeSizeMax,int nNodeFanStop,int nConeFanStop)

{
  Abc_ManCut_t *__s;
  Vec_Ptr_t *pVVar1;
  Vec_Vec_t *pVVar2;
  Abc_ManCut_t *p;
  int nConeFanStop_local;
  int nNodeFanStop_local;
  int nConeSizeMax_local;
  int nNodeSizeMax_local;
  
  __s = (Abc_ManCut_t *)malloc(0x38);
  memset(__s,0,0x38);
  pVVar1 = Vec_PtrAlloc(100);
  __s->vNodeLeaves = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vConeLeaves = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vVisited = pVVar1;
  pVVar2 = Vec_VecAlloc(100);
  __s->vLevels = pVVar2;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vNodesTfo = pVVar1;
  __s->nNodeSizeMax = nNodeSizeMax;
  __s->nConeSizeMax = nConeSizeMax;
  __s->nNodeFanStop = nNodeFanStop;
  __s->nConeFanStop = nConeFanStop;
  return __s;
}

Assistant:

Abc_ManCut_t * Abc_NtkManCutStart( int nNodeSizeMax, int nConeSizeMax, int nNodeFanStop, int nConeFanStop )
{
    Abc_ManCut_t * p;
    p = ABC_ALLOC( Abc_ManCut_t, 1 );
    memset( p, 0, sizeof(Abc_ManCut_t) );
    p->vNodeLeaves  = Vec_PtrAlloc( 100 );
    p->vConeLeaves  = Vec_PtrAlloc( 100 );
    p->vVisited     = Vec_PtrAlloc( 100 );
    p->vLevels      = Vec_VecAlloc( 100 );
    p->vNodesTfo    = Vec_PtrAlloc( 100 );
    p->nNodeSizeMax = nNodeSizeMax;
    p->nConeSizeMax = nConeSizeMax;
    p->nNodeFanStop = nNodeFanStop;
    p->nConeFanStop = nConeFanStop;
    return p;
}